

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O0

void __thiscall
unodb::detail::
basic_inode_48<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
::basic_inode_48(basic_inode_48<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                 *this,db_type *db_instance,inode16_type *source_node,db_leaf_unique_ptr *child,
                tree_depth_type depth)

{
  inode16_type *ctx;
  unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  local_40;
  db_leaf_unique_ptr *local_30;
  db_leaf_unique_ptr *child_local;
  inode16_type *source_node_local;
  db_type *db_instance_local;
  basic_inode_48<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *this_local;
  tree_depth_type depth_local;
  
  local_30 = child;
  child_local = (db_leaf_unique_ptr *)source_node;
  source_node_local = (inode16_type *)db_instance;
  db_instance_local = (db_type *)this;
  this_local._4_4_ = depth.value;
  basic_inode<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>,_17U,_48U,_(unodb::node_type)3,_unodb::detail::inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::inode_256<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::basic_inode((basic_inode<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>,_17U,_48U,_(unodb::node_type)3,_unodb::detail::inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::inode_256<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                 *)this,source_node);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 1,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 2,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 3,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 4,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 5,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 6,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 7,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 8,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 9,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 10,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xb,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xc,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xd,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xe,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xf,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x10,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x11,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x12,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x13,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x14,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x15,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x16,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x17,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x18,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x19,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x1a,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x1b,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x1c,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x1d,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x1e,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x1f,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x20,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x21,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x22,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x23,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x24,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x25,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x26,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x27,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x28,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x29,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x2a,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x2b,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x2c,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x2d,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x2e,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x2f,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x30,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x31,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x32,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x33,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x34,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x35,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x36,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x37,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x38,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x39,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x3a,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x3b,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x3c,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x3d,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x3e,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x3f,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x40,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x41,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x42,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x43,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x44,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x45,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x46,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x47,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x48,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x49,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x4a,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x4b,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x4c,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x4d,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x4e,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x4f,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x50,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x51,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x52,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x53,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x54,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x55,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x56,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x57,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x58,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x59,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x5a,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x5b,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x5c,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x5d,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x5e,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x5f,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x60,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x61,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x62,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 99,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 100,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x65,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x66,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x67,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x68,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x69,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x6a,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x6b,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x6c,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x6d,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x6e,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x6f,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x70,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x71,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x72,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x73,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x74,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x75,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x76,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x77,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x78,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x79,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x7a,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x7b,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x7c,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x7d,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x7e,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x7f,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x80,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x81,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x82,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x83,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x84,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x85,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x86,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x87,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x88,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x89,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x8a,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x8b,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x8c,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x8d,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x8e,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x8f,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x90,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x91,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x92,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x93,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x94,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x95,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x96,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x97,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x98,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x99,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x9a,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x9b,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x9c,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x9d,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x9e,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0x9f,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xa0,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xa1,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xa2,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xa3,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xa4,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xa5,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xa6,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xa7,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xa8,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xa9,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xaa,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xab,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xac,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xad,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xae,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xaf,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xb0,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xb1,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xb2,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xb3,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xb4,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xb5,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xb6,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xb7,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xb8,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xb9,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xba,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xbb,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xbc,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xbd,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xbe,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xbf,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xc0,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xc1,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xc2,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xc3,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xc4,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xc5,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xc6,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 199,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 200,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xc9,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xca,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xcb,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xcc,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xcd,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xce,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xcf,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xd0,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xd1,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xd2,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xd3,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xd4,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xd5,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xd6,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xd7,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xd8,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xd9,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xda,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xdb,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xdc,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xdd,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xde,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xdf,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xe0,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xe1,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xe2,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xe3,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xe4,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xe5,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xe6,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xe7,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xe8,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xe9,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xea,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xeb,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xec,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xed,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xee,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xef,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xf0,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xf1,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xf2,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xf3,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xf4,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xf5,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xf6,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xf7,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xf8,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xf9,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xfa,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xfb,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xfc,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xfd,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xfe,0xff);
  in_fake_critical_section<unsigned_char>::in_fake_critical_section
            ((this->child_indexes)._M_elems + 0xff,0xff);
  children_union::children_union((children_union *)&(this->children).pointer_array);
  ctx = source_node_local;
  std::
  unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ::unique_ptr(&local_40,local_30);
  init(this,(EVP_PKEY_CTX *)ctx);
  std::
  unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ::~unique_ptr(&local_40);
  return;
}

Assistant:

constexpr basic_inode_48(db_type &db_instance,
                           inode16_type &__restrict source_node,
                           db_leaf_unique_ptr &&child,
                           tree_depth_type depth) noexcept
      : parent_class{source_node} {
    init(db_instance, source_node, std::move(child), depth);
  }